

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk78(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk78 *peVar4;
  envy_bios_power_unk78_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk78 *unk78;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk78;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk78.version);
    if ((bios->power).unk78.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk78.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk78.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk78.entriesnum);
      (bios->power).unk78.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk78_entry *)malloc((ulong)(bios->power).unk78.entriesnum << 2);
      (bios->power).unk78.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk78.entriesnum; data = data + 1) {
        (bios->power).unk78.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk78.hlen + data * (bios->power).unk78.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PCIe table version 0x%x\n",
              (ulong)(bios->power).unk78.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk78(struct envy_bios *bios) {
	struct envy_bios_power_unk78 *unk78 = &bios->power.unk78;
	int i, err = 0;

	if (!unk78->offset)
		return -EINVAL;

	bios_u8(bios, unk78->offset + 0x0, &unk78->version);
	switch(unk78->version) {
	case 0x10:
		err |= bios_u8(bios, unk78->offset + 0x1, &unk78->hlen);
		err |= bios_u8(bios, unk78->offset + 0x2, &unk78->rlen);
		err |= bios_u8(bios, unk78->offset + 0x3, &unk78->entriesnum);
		unk78->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PCIe table version 0x%x\n", unk78->version);
		return -EINVAL;
	};

	err = 0;
	unk78->entries = malloc(unk78->entriesnum * sizeof(struct envy_bios_power_unk78_entry));
	for (i = 0; i < unk78->entriesnum; i++) {
		uint32_t data = unk78->offset + unk78->hlen + i * unk78->rlen;

		unk78->entries[i].offset = data;
	}

	return 0;
}